

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O1

idx_t __thiscall
duckdb::PositionalTableScanner::Refill(PositionalTableScanner *this,ExecutionContext *context)

{
  DataChunk *this_00;
  _Atomic_word *p_Var1;
  int iVar2;
  reference this_01;
  NotImplementedException *this_02;
  size_type __n;
  idx_t iVar3;
  InterruptState interrupt_state;
  OperatorSourceInput source_input;
  string local_90;
  InterruptState local_70;
  GlobalSourceState *local_48;
  type local_40;
  InterruptState *local_38;
  
  this_00 = &this->source;
  if ((this->source).count <= this->source_offset) {
    if (this->exhausted == false) {
      DataChunk::Reset(this_00);
      InterruptState::InterruptState(&local_70);
      local_48 = this->global_state;
      local_40 = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                 ::operator*(&this->local_state);
      local_38 = &local_70;
      iVar2 = (*this->table->_vptr_PhysicalOperator[0x11])(this->table,context,this_00);
      if ((char)iVar2 == '\x02') {
        this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "Unexpected interrupt from table Source in PositionalTableScanner refill","");
        NotImplementedException::NotImplementedException(this_02,&local_90);
        __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      if (local_70.signal_state.internal.
          super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_70.signal_state.internal.
                     super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
          iVar2 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar2 = (local_70.signal_state.internal.
                   super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
          (local_70.signal_state.internal.
           super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
        }
        if (iVar2 == 1) {
          (*(local_70.signal_state.internal.
             super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        }
      }
      if (local_70.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_70.current_task.internal.
                     super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_weak_count;
          iVar2 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar2 = (local_70.current_task.internal.
                   super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (local_70.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
        }
        if (iVar2 == 1) {
          (*(local_70.current_task.internal.
             super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
    }
    this->source_offset = 0;
  }
  iVar3 = (this->source).count - this->source_offset;
  if ((iVar3 == 0) && (this->exhausted == false)) {
    DataChunk::Reset(this_00);
    if ((this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_01 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
        Vector::SetVectorType(this_01,CONSTANT_VECTOR);
        ConstantVector::SetNull(this_01,true);
        __n = __n + 1;
      } while (__n < (ulong)(((long)(this->source).data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->source).data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
    }
    this->exhausted = true;
  }
  return iVar3;
}

Assistant:

idx_t Refill(ExecutionContext &context) {
		if (source_offset >= source.size()) {
			if (!exhausted) {
				source.Reset();

				InterruptState interrupt_state;
				OperatorSourceInput source_input {global_state, *local_state, interrupt_state};
				auto source_result = table.GetData(context, source, source_input);
				if (source_result == SourceResultType::BLOCKED) {
					throw NotImplementedException(
					    "Unexpected interrupt from table Source in PositionalTableScanner refill");
				}
			}
			source_offset = 0;
		}

		const auto available = source.size() - source_offset;
		if (!available) {
			if (!exhausted) {
				source.Reset();
				for (idx_t i = 0; i < source.ColumnCount(); ++i) {
					auto &vec = source.data[i];
					vec.SetVectorType(VectorType::CONSTANT_VECTOR);
					ConstantVector::SetNull(vec, true);
				}
				exhausted = true;
			}
		}

		return available;
	}